

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

double __thiscall soplex::SLUFactor<double>::stability(SLUFactor<double> *this)

{
  int iVar1;
  long *in_RDI;
  double local_8;
  
  iVar1 = (**(code **)(*in_RDI + 8))();
  if (iVar1 == 0) {
    if ((double)in_RDI[4] <= (double)in_RDI[5]) {
      local_8 = (double)in_RDI[4] / (double)in_RDI[5];
    }
    else {
      local_8 = 1.0;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

R SLUFactor<R>::stability() const
{
   if(status() != this->OK)
      return 0;

   if(this->maxabs < this->initMaxabs)
      return 1;

   assert(this->maxabs != 0.0);
   return this->initMaxabs / this->maxabs;
}